

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_constant_expression.cpp
# Opt level: O0

bool constant_referenced(ir_dereference *deref,hash_table *variable_context,ir_constant **store,
                        int *offset)

{
  ir_node_type iVar1;
  exec_node *peVar2;
  bool bVar3;
  ir_constant *piVar4;
  hash_entry *phVar5;
  uint local_a0;
  hash_entry *entry;
  ir_dereference_variable *dv;
  ir_constant *piStack_80;
  int suboffset_1;
  ir_constant *substore_1;
  ir_dereference *deref_2;
  ir_dereference_record *dr;
  glsl_type *vt;
  ir_dereference *deref_1;
  ir_constant *piStack_50;
  int suboffset;
  ir_constant *substore;
  ir_constant *piStack_40;
  int index;
  ir_constant *index_c;
  ir_dereference_array *da;
  int *offset_local;
  ir_constant **store_local;
  hash_table *variable_context_local;
  ir_dereference *deref_local;
  
  *store = (ir_constant *)0x0;
  *offset = 0;
  if (variable_context == (hash_table *)0x0) {
    deref_local._7_1_ = false;
  }
  else {
    iVar1 = (deref->super_ir_rvalue).super_ir_instruction.ir_type;
    da = (ir_dereference_array *)offset;
    offset_local = (int *)store;
    store_local = (ir_constant **)variable_context;
    variable_context_local = (hash_table *)deref;
    if (iVar1 == ir_type_dereference_array) {
      peVar2 = deref[1].super_ir_rvalue.super_ir_instruction.super_exec_node.next;
      index_c = (ir_constant *)deref;
      piStack_40 = (ir_constant *)(*(code *)peVar2->next[3].next)(peVar2,variable_context,0);
      if (((piStack_40 != (ir_constant *)0x0) &&
          (bVar3 = glsl_type::is_scalar((piStack_40->super_ir_rvalue).type), bVar3)) &&
         (bVar3 = glsl_type::is_integer_32((piStack_40->super_ir_rvalue).type), bVar3)) {
        if ((*(uint *)&((piStack_40->super_ir_rvalue).type)->field_0x4 & 0xff) == 1) {
          local_a0 = ir_constant::get_int_component(piStack_40,0);
        }
        else {
          local_a0 = ir_constant::get_uint_component(piStack_40,0);
        }
        substore._4_4_ = local_a0;
        vt = (glsl_type *)ir_instruction::as_dereference((ir_instruction *)(index_c->value).d[0]);
        if ((vt != (glsl_type *)0x0) &&
           (bVar3 = constant_referenced((ir_dereference *)vt,(hash_table *)store_local,
                                        &stack0xffffffffffffffb0,(int *)((long)&deref_1 + 4)), bVar3
           )) {
          dr = *(ir_dereference_record **)((index_c->value).u64[0] + 0x20);
          bVar3 = glsl_type::is_array((glsl_type *)dr);
          if (bVar3) {
            piVar4 = ir_constant::get_array_element(piStack_50,substore._4_4_);
            *(ir_constant **)offset_local = piVar4;
            *(undefined4 *)
             &(da->super_ir_dereference).super_ir_rvalue.super_ir_instruction._vptr_ir_instruction =
                 0;
          }
          else {
            bVar3 = glsl_type::is_matrix((glsl_type *)dr);
            if (bVar3) {
              *(ir_constant **)offset_local = piStack_50;
              *(uint *)&(da->super_ir_dereference).super_ir_rvalue.super_ir_instruction.
                        _vptr_ir_instruction =
                   substore._4_4_ *
                   *(byte *)&(dr->super_ir_dereference).super_ir_rvalue.super_ir_instruction.
                             super_exec_node.next;
            }
            else {
              bVar3 = glsl_type::is_vector((glsl_type *)dr);
              if (bVar3) {
                *(ir_constant **)offset_local = piStack_50;
                *(uint *)&(da->super_ir_dereference).super_ir_rvalue.super_ir_instruction.
                          _vptr_ir_instruction = deref_1._4_4_ + substore._4_4_;
              }
            }
          }
        }
      }
    }
    else if (iVar1 == ir_type_dereference_record) {
      deref_2 = deref;
      substore_1 = (ir_constant *)
                   ir_instruction::as_dereference
                             ((ir_instruction *)
                              deref[1].super_ir_rvalue.super_ir_instruction._vptr_ir_instruction);
      if ((substore_1 != (ir_constant *)0x0) &&
         (bVar3 = constant_referenced((ir_dereference *)substore_1,(hash_table *)store_local,
                                      &stack0xffffffffffffff80,(int *)((long)&dv + 4)), bVar3)) {
        if (dv._4_4_ != 0) {
          __assert_fail("suboffset == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/ir_constant_expression.cpp"
                        ,0x220,
                        "bool constant_referenced(const ir_dereference *, struct hash_table *, ir_constant *&, int &)"
                       );
        }
        piVar4 = ir_constant::get_record_field
                           (piStack_80,
                            *(int *)&deref_2[1].super_ir_rvalue.super_ir_instruction.super_exec_node
                                     .next);
        *(ir_constant **)offset_local = piVar4;
      }
    }
    else {
      if (iVar1 != ir_type_dereference_variable) {
        __assert_fail("!\"Should not get here.\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/ir_constant_expression.cpp"
                      ,0x231,
                      "bool constant_referenced(const ir_dereference *, struct hash_table *, ir_constant *&, int &)"
                     );
      }
      phVar5 = _mesa_hash_table_search
                         (variable_context,
                          deref[1].super_ir_rvalue.super_ir_instruction._vptr_ir_instruction);
      if (phVar5 != (hash_entry *)0x0) {
        *(void **)offset_local = phVar5->data;
      }
    }
    deref_local._7_1_ = *(long *)offset_local != 0;
  }
  return deref_local._7_1_;
}

Assistant:

static bool
constant_referenced(const ir_dereference *deref,
                    struct hash_table *variable_context,
                    ir_constant *&store, int &offset)
{
   store = NULL;
   offset = 0;

   if (variable_context == NULL)
      return false;

   switch (deref->ir_type) {
   case ir_type_dereference_array: {
      const ir_dereference_array *const da =
         (const ir_dereference_array *) deref;

      ir_constant *const index_c =
         da->array_index->constant_expression_value(variable_context);

      if (!index_c || !index_c->type->is_scalar() ||
          !index_c->type->is_integer_32())
         break;

      const int index = index_c->type->base_type == GLSL_TYPE_INT ?
         index_c->get_int_component(0) :
         index_c->get_uint_component(0);

      ir_constant *substore;
      int suboffset;

      const ir_dereference *const deref = da->array->as_dereference();
      if (!deref)
         break;

      if (!constant_referenced(deref, variable_context, substore, suboffset))
         break;

      const glsl_type *const vt = da->array->type;
      if (vt->is_array()) {
         store = substore->get_array_element(index);
         offset = 0;
      } else if (vt->is_matrix()) {
         store = substore;
         offset = index * vt->vector_elements;
      } else if (vt->is_vector()) {
         store = substore;
         offset = suboffset + index;
      }

      break;
   }

   case ir_type_dereference_record: {
      const ir_dereference_record *const dr =
         (const ir_dereference_record *) deref;

      const ir_dereference *const deref = dr->record->as_dereference();
      if (!deref)
         break;

      ir_constant *substore;
      int suboffset;

      if (!constant_referenced(deref, variable_context, substore, suboffset))
         break;

      /* Since we're dropping it on the floor...
       */
      assert(suboffset == 0);

      store = substore->get_record_field(dr->field_idx);
      break;
   }

   case ir_type_dereference_variable: {
      const ir_dereference_variable *const dv =
         (const ir_dereference_variable *) deref;

      hash_entry *entry = _mesa_hash_table_search(variable_context, dv->var);
      if (entry)
         store = (ir_constant *) entry->data;
      break;
   }

   default:
      assert(!"Should not get here.");
      break;
   }

   return store != NULL;
}